

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O2

void __thiscall FileSystemForJUnitTestOutputTests::clear(FileSystemForJUnitTestOutputTests *this)

{
  FileForJUnitOutputTests *this_00;
  FileForJUnitOutputTests *fileToBeDeleted;
  
  while (this_00 = this->firstFile_, this_00 != (FileForJUnitOutputTests *)0x0) {
    this->firstFile_ = this_00->next_;
    FileForJUnitOutputTests::~FileForJUnitOutputTests(this_00);
    operator_delete(this_00,0x50);
  }
  return;
}

Assistant:

void clear(void)
    {
        while (firstFile_) {
            FileForJUnitOutputTests* fileToBeDeleted = firstFile_;
            firstFile_ = firstFile_->nextFile();
            delete fileToBeDeleted;
        }
    }